

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O1

void __thiscall crnlib::crn_comp::optimize_color(crn_comp *this)

{
  int *piVar1;
  bool bVar2;
  uint8 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  endpoint_indices_details *peVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  long *pData_ptr;
  executable_task *pObj;
  uint __tmp_4;
  uint uVar12;
  ulong uVar13;
  undefined2 uVar14;
  uint uVar15;
  unsigned_short *__tmp_3;
  ulong uVar17;
  unsigned_short *puVar18;
  unsigned_short *puVar19;
  uint uVar20;
  uint __tmp_1;
  uint uVar21;
  uchar *__tmp;
  uchar *puVar22;
  uchar *puVar23;
  uint8 uVar24;
  long lVar25;
  undefined4 *puVar26;
  uint uVar27;
  uint min_new_capacity;
  dxt1_block *pdVar28;
  uint i;
  uint64 data;
  vector<unsigned_int> sum;
  vector<crnlib::optimize_color_params::unpacked_endpoint> unpacked_endpoints;
  vector<unsigned_int> hist;
  result remapping_trial [4];
  elemental_vector local_118;
  elemental_vector local_108;
  elemental_vector local_f8;
  task_pool *local_e8;
  undefined8 local_e0;
  dxt1_block local_d8;
  uint8 auStack_d0 [8];
  uint8 auStack_c8 [8];
  uint8 auStack_c0 [144];
  ulong uVar16;
  
  uVar10 = (this->m_color_endpoints).m_size;
  local_e0 = (ulong)uVar10;
  uVar9 = (ushort)uVar10;
  local_f8.m_p = (void *)0x0;
  local_f8.m_size = 0;
  local_f8.m_capacity = 0;
  if ((ulong)uVar9 != 0) {
    uVar15 = (uVar10 & 0xffff) * (uVar10 & 0xffff);
    elemental_vector::increase_capacity(&local_f8,uVar15,uVar15 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_f8._8_8_ & 0xffffffff) * 4 + (long)local_f8.m_p),0,
           (ulong)(uVar15 - local_f8.m_size) << 2);
    local_f8.m_size = uVar15;
  }
  local_118.m_p = (void *)0x0;
  local_118.m_size = 0;
  local_118.m_capacity = 0;
  uVar27 = uVar10 & 0xffff;
  min_new_capacity = uVar10 & 0xffff;
  if (uVar27 != 0) {
    elemental_vector::increase_capacity(&local_118,uVar27,uVar27 == 1,4,(object_mover)0x0,false);
    memset((void *)((local_118._8_8_ & 0xffffffff) * 4 + (long)local_118.m_p),0,
           (ulong)(min_new_capacity - local_118.m_size) << 2);
    local_118._8_8_ = CONCAT44(local_118.m_capacity,uVar10) & 0xffffffff0000ffff;
  }
  if ((this->m_endpoint_indices).m_size != 0) {
    peVar8 = (this->m_endpoint_indices).m_p;
    bVar2 = this->m_has_subblocks;
    uVar17 = 0;
    uVar27 = 0;
    do {
      uVar21 = (uint)peVar8[uVar17].field_0.field_0.color;
      uVar3 = peVar8[uVar17].reference;
      uVar24 = uVar3;
      if (bVar2 == false) {
        uVar24 = uVar3 == '\0';
      }
      if ((uVar17 & 1) == 0) {
        uVar24 = uVar3 == '\0';
      }
      if ((uVar24 != '\0') && (uVar27 != uVar21)) {
        piVar1 = (int *)((long)local_f8.m_p + (ulong)(min_new_capacity * uVar21 + uVar27) * 4);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)((long)local_f8.m_p + (ulong)(uVar27 * min_new_capacity + uVar21) * 4);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)((long)local_118.m_p + (ulong)uVar21 * 4);
        *piVar1 = *piVar1 + 1;
        piVar1 = (int *)((long)local_118.m_p + (ulong)uVar27 * 4);
        *piVar1 = *piVar1 + 1;
      }
      uVar17 = uVar17 + 1;
      uVar27 = uVar21;
    } while (uVar17 < (this->m_endpoint_indices).m_size);
  }
  uVar27 = 0;
  if ((uVar10 & 0xffff) == 0) {
    uVar14 = 0;
  }
  else {
    uVar13 = 0;
    uVar17 = 0;
    do {
      uVar21 = *(uint *)((long)local_118.m_p + uVar13 * 4);
      uVar16 = uVar13 & 0xffffffff;
      if (uVar21 <= uVar27) {
        uVar16 = uVar17;
      }
      uVar14 = (undefined2)uVar16;
      if (uVar27 <= uVar21) {
        uVar27 = uVar21;
      }
      uVar13 = uVar13 + 1;
      uVar17 = uVar16;
    } while (uVar9 != uVar13);
  }
  local_108.m_p = (void *)0x0;
  local_108.m_size = 0;
  local_108.m_capacity = 0;
  if ((uVar10 & 0xffff) != 0) {
    elemental_vector::increase_capacity
              (&local_108,min_new_capacity,min_new_capacity == 1,8,
               vector<crnlib::optimize_color_params::unpacked_endpoint>::object_mover,false);
    local_108._8_8_ = CONCAT44(local_108.m_capacity,uVar10) & 0xffffffff0000ffff;
    lVar25 = 0;
    do {
      uVar10 = (this->m_color_endpoints).m_p[lVar25];
      if (this->m_has_etc_color_blocks == true) {
        uVar10 = uVar10 & 0xffffff;
      }
      else {
        dxt1_block::unpack_color(&local_d8,(uint16)uVar10,true,0xff);
        uVar10 = local_d8._0_4_;
      }
      *(uint *)((long)local_108.m_p + lVar25 * 8) = uVar10;
      uVar10 = (this->m_color_endpoints).m_p[lVar25];
      if (this->m_has_etc_color_blocks == true) {
        uVar10 = uVar10 >> 0x18;
      }
      else {
        dxt1_block::unpack_color(&local_d8,(uint16)(uVar10 >> 0x10),true,0xff);
        uVar10 = local_d8._0_4_;
      }
      *(uint *)((long)local_108.m_p + lVar25 * 8 + 4) = uVar10;
      lVar25 = lVar25 + 1;
    } while ((ushort)lVar25 < uVar9);
  }
  lVar25 = 0;
  do {
    *(undefined8 *)((&local_d8)[2].m_low_color + lVar25) = 0;
    *(undefined8 *)((&local_d8)[3].m_low_color + lVar25) = 0;
    *(undefined8 *)(local_d8.m_low_color + lVar25) = 0;
    *(undefined8 *)((&local_d8)[1].m_low_color + lVar25) = 0;
    lVar25 = lVar25 + 0x28;
  } while (lVar25 != 0xa0);
  local_e8 = &this->m_task_pool;
  puVar26 = &DAT_001abd90;
  pdVar28 = &local_d8;
  data = 0;
  do {
    pData_ptr = (long *)crnlib_malloc(0x20);
    *pData_ptr = (long)local_108.m_p;
    pData_ptr[1] = (long)local_f8.m_p;
    *(short *)(pData_ptr + 2) = (short)local_e0;
    *(undefined2 *)((long)pData_ptr + 0x12) = uVar14;
    *(undefined4 *)((long)pData_ptr + 0x14) = *puVar26;
    pData_ptr[3] = (long)pdVar28;
    pObj = (executable_task *)crnlib_malloc(0x28);
    pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001ce928;
    pObj[1]._vptr_executable_task = (_func_int **)this;
    pObj[2]._vptr_executable_task = (_func_int **)optimize_color_endpoints_task;
    pObj[3]._vptr_executable_task = (_func_int **)0x0;
    *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
    task_pool::queue_task(local_e8,pObj,data,pData_ptr);
    data = data + 1;
    puVar26 = puVar26 + 1;
    pdVar28 = pdVar28 + 5;
  } while (data != 4);
  task_pool::join(local_e8);
  uVar15 = (this->m_packed_color_endpoints).m_size;
  uVar20 = (this->m_packed_color_endpoints).m_capacity;
  uVar12 = this->m_endpoint_remaping[0].m_size;
  uVar11 = this->m_endpoint_remaping[0].m_capacity;
  uVar10 = 0xffffffff;
  lVar25 = 0x20;
  puVar18 = this->m_endpoint_remaping[0].m_p;
  puVar22 = (this->m_packed_color_endpoints).m_p;
  do {
    uVar27 = *(uint *)(local_d8.m_low_color + lVar25);
    puVar19 = puVar18;
    puVar23 = puVar22;
    if (uVar27 < uVar10) {
      puVar23 = *(uchar **)((long)&local_e8 + lVar25);
      (this->m_packed_color_endpoints).m_p = puVar23;
      *(uchar **)((long)&local_e8 + lVar25) = puVar22;
      uVar4 = *(uint *)((&local_d8)[-1].m_low_color + lVar25);
      (this->m_packed_color_endpoints).m_size = uVar4;
      *(uint *)((&local_d8)[-1].m_low_color + lVar25) = uVar15;
      uVar5 = *(uint *)(local_d8.m_low_color + lVar25 + -4);
      (this->m_packed_color_endpoints).m_capacity = uVar5;
      *(uint *)(local_d8.m_low_color + lVar25 + -4) = uVar20;
      puVar19 = *(unsigned_short **)((long)&local_f8.m_p + lVar25);
      this->m_endpoint_remaping[0].m_p = puVar19;
      *(unsigned_short **)((long)&local_f8.m_p + lVar25) = puVar18;
      uVar6 = *(uint *)((long)&local_f8.m_size + lVar25);
      this->m_endpoint_remaping[0].m_size = uVar6;
      *(uint *)((long)&local_f8.m_size + lVar25) = uVar12;
      uVar7 = *(uint *)((long)&local_f8.m_capacity + lVar25);
      this->m_endpoint_remaping[0].m_capacity = uVar7;
      *(uint *)((long)&local_f8.m_capacity + lVar25) = uVar11;
      uVar15 = uVar4;
      uVar20 = uVar5;
      uVar12 = uVar6;
      uVar11 = uVar7;
      uVar10 = uVar27;
    }
    lVar25 = lVar25 + 0x28;
    puVar18 = puVar19;
    puVar22 = puVar23;
  } while (lVar25 != 0xc0);
  lVar25 = 0x78;
  do {
    if (*(void **)((&local_d8)[2].m_low_color + lVar25) != (void *)0x0) {
      crnlib_free(*(void **)((&local_d8)[2].m_low_color + lVar25));
    }
    if (*(void **)(local_d8.m_low_color + lVar25) != (void *)0x0) {
      crnlib_free(*(void **)(local_d8.m_low_color + lVar25));
    }
    lVar25 = lVar25 + -0x28;
  } while (lVar25 != -0x28);
  if (local_108.m_p != (void *)0x0) {
    crnlib_free(local_108.m_p);
  }
  if (local_118.m_p != (void *)0x0) {
    crnlib_free(local_118.m_p);
  }
  if (local_f8.m_p != (void *)0x0) {
    crnlib_free(local_f8.m_p);
  }
  return;
}

Assistant:

void crn_comp::optimize_color()
    {
        uint16 n = m_color_endpoints.size();
        crnlib::vector<uint> hist(n * n);
        crnlib::vector<uint> sum(n);
        for (uint i, i_prev = 0, b = 0; b < m_endpoint_indices.size(); b++, i_prev = i)
        {
            i = m_endpoint_indices[b].color;
            if ((m_has_subblocks && b & 1 ? m_endpoint_indices[b].reference : !m_endpoint_indices[b].reference) && i != i_prev)
            {
                hist[i * n + i_prev]++;
                hist[i_prev * n + i]++;
                sum[i]++;
                sum[i_prev]++;
            }
        }
        uint16 selected = 0;
        uint best_sum = 0;
        for (uint16 i = 0; i < n; i++)
        {
            if (best_sum < sum[i])
            {
                best_sum = sum[i];
                selected = i;
            }
        }
        crnlib::vector<optimize_color_params::unpacked_endpoint> unpacked_endpoints(n);
        for (uint16 i = 0; i < n; i++)
        {
            unpacked_endpoints[i].low.m_u32 = m_has_etc_color_blocks ? m_color_endpoints[i] & 0xFFFFFF : dxt1_block::unpack_color(m_color_endpoints[i] & 0xFFFF, true).m_u32;
            unpacked_endpoints[i].high.m_u32 = m_has_etc_color_blocks ? m_color_endpoints[i] >> 24 : dxt1_block::unpack_color(m_color_endpoints[i] >> 16, true).m_u32;
        }

        optimize_color_params::result remapping_trial[4];
        float weights[4] = { 0, 0, 1.0f / 6.0f, 0.5f };
        for (uint i = 0; i < 4; i++)
        {
            optimize_color_params* pParams = crnlib_new<optimize_color_params>();
            pParams->unpacked_endpoints = unpacked_endpoints.get_ptr();
            pParams->hist = hist.get_ptr();
            pParams->n = n;
            pParams->selected = selected;
            pParams->weight = weights[i];
            pParams->pResult = remapping_trial + i;
            m_task_pool.queue_object_task(this, &crn_comp::optimize_color_endpoints_task, i, pParams);
        }
        m_task_pool.join();

        for (uint best_bits = cUINT32_MAX, i = 0; i < 4; i++)
        {
            if (remapping_trial[i].total_bits < best_bits)
            {
                m_packed_color_endpoints.swap(remapping_trial[i].packed_endpoints);
                m_endpoint_remaping[cColor].swap(remapping_trial[i].endpoint_remapping);
                best_bits = remapping_trial[i].total_bits;
            }
        }
    }